

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_cmdline.c
# Opt level: O0

ssize_t get_argument(archive_string *as,char *p)

{
  ssize_t sVar1;
  bool bVar2;
  ssize_t q;
  char *s;
  char *p_local;
  archive_string *as_local;
  
  as->length = 0;
  q = (ssize_t)p;
  while( true ) {
    bVar2 = false;
    if (*(char *)q != '\0') {
      bVar2 = *(char *)q == ' ';
    }
    if (!bVar2) break;
    q = q + 1;
  }
  while( true ) {
    bVar2 = false;
    if (*(char *)q != '\0') {
      bVar2 = *(char *)q != ' ';
    }
    if (!bVar2) break;
    if (*(char *)q == '\\') {
      if (*(char *)(q + 1) == '\0') {
        q = q + 1;
        break;
      }
      archive_strappend_char(as,*(char *)(q + 1));
      q = q + 2;
    }
    else if (*(char *)q == '\"') {
      sVar1 = extract_quotation(as,(char *)q);
      if (sVar1 < 0) {
        return -0x19;
      }
      q = sVar1 + q;
    }
    else {
      archive_strappend_char(as,*(char *)q);
      q = q + 1;
    }
  }
  return q - (long)p;
}

Assistant:

static ssize_t
get_argument(struct archive_string *as, const char *p)
{
	const char *s = p;

	archive_string_empty(as);

	/* Skip beginning space characters. */
	while (*s != '\0' && *s == ' ')
		s++;
	/* Copy non-space characters. */
	while (*s != '\0' && *s != ' ') {
		if (*s == '\\') {
			if (s[1] != '\0') {
				archive_strappend_char(as, s[1]);
				s += 2;
			} else {
				s++;/* Ignore this character.*/
				break;
			}
		} else if (*s == '"') {
			ssize_t q = extract_quotation(as, s);
			if (q < 0)
				return (ARCHIVE_FAILED);/* Invalid sequence. */
			s += q;
		} else {
			archive_strappend_char(as, s[0]);
			s++;
		}
	}
	return ((ssize_t)(s - p));
}